

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_equal_mem(char *file,wchar_t line,void *_v1,char *e1,void *_v2,char *e2,size_t l,
                           char *ld,void *extra)

{
  int iVar1;
  wchar_t wVar2;
  size_t offset;
  char *pcVar3;
  size_t l_00;
  char *p;
  
  msg = nextmsg;
  assertions = assertions + L'\x01';
  nextmsg = (char *)0x0;
  wVar2 = L'\x01';
  if (_v1 != _v2) {
    if ((_v2 != (void *)0x0 && _v1 != (void *)0x0) && (iVar1 = bcmp(_v1,_v2,l), iVar1 == 0)) {
      return L'\x01';
    }
    wVar2 = L'\0';
    if (_v2 != (void *)0x0 && _v1 != (void *)0x0) {
      offset = 0;
      failure_start(file,line,"%s != %s",e1,e2);
      logprintf("      size %s = %d\n",ld,l & 0xffffffff);
      while( true ) {
        p = (char *)((long)_v1 + offset);
        pcVar3 = (char *)((long)_v2 + offset);
        if ((l < 0x41) || (iVar1 = bcmp(p,pcVar3,0x20), iVar1 != 0)) break;
        l = l - 0x10;
        offset = offset + 0x10;
      }
      logprintf("      Dump of %s\n",e1);
      l_00 = 0x80;
      if (l < 0x80) {
        l_00 = l;
      }
      hexdump(p,pcVar3,l_00,offset);
      logprintf("      Dump of %s\n",e2);
      hexdump(pcVar3,p,l_00,offset);
      pcVar3 = "\n";
      logprintf("\n");
      failure_finish(pcVar3);
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

int
assertion_equal_mem(const char *file, int line,
    const void *_v1, const char *e1,
    const void *_v2, const char *e2,
    size_t l, const char *ld, void *extra)
{
	const char *v1 = (const char *)_v1;
	const char *v2 = (const char *)_v2;
	size_t offset;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && memcmp(v1, v2, l) == 0))
		return (1);
	if (v1 == NULL || v2 == NULL)
		return (0);

	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      size %s = %d\n", ld, (int)l);
	/* Dump 48 bytes (3 lines) so that the first difference is
	 * in the second line. */
	offset = 0;
	while (l > 64 && memcmp(v1, v2, 32) == 0) {
		/* Two lines agree, so step forward one line. */
		v1 += 16;
		v2 += 16;
		l -= 16;
		offset += 16;
	}
	logprintf("      Dump of %s\n", e1);
	hexdump(v1, v2, l < 128 ? l : 128, offset);
	logprintf("      Dump of %s\n", e2);
	hexdump(v2, v1, l < 128 ? l : 128, offset);
	logprintf("\n");
	failure_finish(extra);
	return (0);
}